

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_ForkJoin.H
# Opt level: O1

Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> * __thiscall
amrex::ForkJoin::get_mf_vec
          (Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *__return_storage_ptr__,
          ForkJoin *this,string *name)

{
  void *pvVar1;
  iterator iVar2;
  mapped_type *pmVar3;
  undefined8 uVar4;
  ulong uVar5;
  uint uVar6;
  long lVar7;
  undefined8 *unaff_R14;
  allocator_type local_39;
  string *local_38;
  
  local_38 = name;
  iVar2 = std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_amrex::Vector<amrex::ForkJoin::MFFork,_std::allocator<amrex::ForkJoin::MFFork>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_amrex::Vector<amrex::ForkJoin::MFFork,_std::allocator<amrex::ForkJoin::MFFork>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::find(&(this->data)._M_h,name);
  if (iVar2.
      super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_amrex::Vector<amrex::ForkJoin::MFFork,_std::allocator<amrex::ForkJoin::MFFork>_>_>,_true>
      ._M_cur != (__node_type *)0x0) {
    uVar6 = (int)(*(long *)((long)iVar2.
                                  super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_amrex::Vector<amrex::ForkJoin::MFFork,_std::allocator<amrex::ForkJoin::MFFork>_>_>,_true>
                                  ._M_cur + 0x30) -
                  *(long *)((long)iVar2.
                                  super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_amrex::Vector<amrex::ForkJoin::MFFork,_std::allocator<amrex::ForkJoin::MFFork>_>_>,_true>
                                  ._M_cur + 0x28) >> 4) * -0x33333333;
    std::vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>::vector
              (&__return_storage_ptr__->
                super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>,(long)(int)uVar6
               ,&local_39);
    if (0 < (int)uVar6) {
      lVar7 = 7;
      uVar5 = 0;
      do {
        pmVar3 = std::__detail::
                 _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_amrex::Vector<amrex::ForkJoin::MFFork,_std::allocator<amrex::ForkJoin::MFFork>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_amrex::Vector<amrex::ForkJoin::MFFork,_std::allocator<amrex::ForkJoin::MFFork>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                 ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_amrex::Vector<amrex::ForkJoin::MFFork,_std::allocator<amrex::ForkJoin::MFFork>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_amrex::Vector<amrex::ForkJoin::MFFork,_std::allocator<amrex::ForkJoin::MFFork>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                               *)&this->data,local_38);
        (__return_storage_ptr__->super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>
        ).super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>._M_impl.
        super__Vector_impl_data._M_start[uVar5] =
             (MultiFab *)
             ((long)this->task_me * 0x180 +
             *(long *)((long)(((pmVar3->
                               super_vector<amrex::ForkJoin::MFFork,_std::allocator<amrex::ForkJoin::MFFork>_>
                               ).
                               super__Vector_base<amrex::ForkJoin::MFFork,_std::allocator<amrex::ForkJoin::MFFork>_>
                               ._M_impl.super__Vector_impl_data._M_start)->ngrow).vect +
                      lVar7 * 8 + -0x14));
        uVar5 = uVar5 + 1;
        lVar7 = lVar7 + 10;
      } while ((uVar6 & 0x7fffffff) != uVar5);
    }
    return __return_storage_ptr__;
  }
  uVar4 = std::__throw_out_of_range("_Map_base::at");
  pvVar1 = (void *)*unaff_R14;
  if (pvVar1 != (void *)0x0) {
    operator_delete(pvVar1,unaff_R14[2] - (long)pvVar1);
  }
  _Unwind_Resume(uVar4);
}

Assistant:

Vector<MultiFab *> get_mf_vec (const std::string &name) {
        int dim = data.at(name).size();
        Vector<MultiFab *> result(dim);
        for (int idx = 0; idx < dim; ++idx) {
            result[idx] = &get_mf(name, idx);
        }
        return result;
    }